

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4447fb::AbiTagAttr::printLeft(AbiTagAttr *this,OutputStream *S)

{
  StringView local_48;
  char *local_38;
  char *local_30;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  AbiTagAttr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  (*this->Base->_vptr_Node[4])(this->Base,S);
  StringView::StringView(&local_28,"[abi:");
  OutputStream::operator+=(local_18,local_28);
  local_38 = (this->Tag).First;
  local_30 = (this->Tag).Last;
  OutputStream::operator+=(local_18,this->Tag);
  StringView::StringView(&local_48,"]");
  OutputStream::operator+=(local_18,local_48);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Base->printLeft(S);
    S += "[abi:";
    S += Tag;
    S += "]";
  }